

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O0

void __thiscall Symbol::Symbol(Symbol *this,SymbolName *name,ParseNode *decl,SymbolType symbolType)

{
  bool bVar1;
  CharacterBuffer<char16_t> *this_00;
  char16_t *pcVar2;
  SymbolType symbolType_local;
  ParseNode *decl_local;
  SymbolName *name_local;
  Symbol *this_local;
  
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer(&this->name,name);
  this->pid = (IdentPtr)0x0;
  this->decl = decl;
  this->scope = (Scope *)0x0;
  this->position = -1;
  this->location = 0xffffffff;
  this->scopeSlot = -1;
  this->moduleIndex = -1;
  this->next = (Symbol *)0x0;
  this->symbolType = symbolType;
  this->defCount = '\0';
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfffe;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfffd;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfffb;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfff7;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xffef;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xffdf;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xffbf;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xff7f;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfeff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfdff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xfbff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xf7ff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xefff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xdfff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0xbfff;
  *(ushort *)&this->field_0x42 = *(ushort *)&this->field_0x42 & 0x7fff;
  this->field_0x44 = this->field_0x44 & 0xfe;
  this->field_0x44 = this->field_0x44 & 0xfd;
  this->field_0x44 = this->field_0x44 & 0xfb;
  this->field_0x44 = this->field_0x44 & 0xf7;
  this->field_0x44 = this->field_0x44 & 0xef;
  this->field_0x44 = this->field_0x44 & 0xdf;
  this->field_0x44 = this->field_0x44 & 0xbf;
  this->hasFuncAssignment = false;
  this->hasMaybeEscapedUse = false;
  this->isNonSimpleParameter = false;
  this->assignmentState = NotAssigned;
  SetSymbolType(this,symbolType);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase);
  if ((bVar1) && ((this->hasFuncAssignment & 1U) != 0)) {
    this_00 = GetName(this);
    pcVar2 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_00);
    Output::Print(L"HasFuncDecl: %s\n",pcVar2);
    Output::Flush();
  }
  return;
}

Assistant:

Symbol(SymbolName const& name, ParseNode* decl, SymbolType symbolType) :
        name(name),
        pid(nullptr),
        decl(decl),
        scope(nullptr),
        position(Js::Constants::NoProperty),
        location(Js::Constants::NoRegister),
        scopeSlot(Js::Constants::NoProperty),
        moduleIndex(Js::Constants::NoProperty),
        next(nullptr),
        symbolType(symbolType), // will get set to the same value in SetSymbolType
        defCount(0),
        needDeclaration(false),
        isBlockVar(false),
        isConst(false),
        isGlobal(false),
        hasNonLocalReference(false),
        isFuncExpr(false),
        isCatch(false),
        hasInit(false),
        isUsed(false),
        isGlobalCatch(false),
        isCommittedToSlot(false),
        hasNonCommittedReference(false),
        hasVisitedCapturingFunc(false),
        isTrackedForDebugger(false),
        isModuleExportStorage(false),
        isModuleImport(false),
        isUsedInLdElem(false),
        isThis(false),
        isNewTarget(false),
        isSuper(false),
        isSuperConstructor(false),
        isImportMeta(false),
        needsScopeObject(false),
        hasFuncAssignment(false), // will get reset by SetSymbolType
        hasMaybeEscapedUse(false), // will get reset by SetSymbolType
        isNonSimpleParameter(false),
        assignmentState(NotAssigned)
    {
        SetSymbolType(symbolType);

        if (PHASE_TESTTRACE1(Js::StackFuncPhase) && hasFuncAssignment)
        {
            Output::Print(_u("HasFuncDecl: %s\n"), this->GetName().GetBuffer());
            Output::Flush();
        }
    }